

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

Vec_Ptr_t * Llb_Nonlin4Multiply(DdManager *dd,DdNode *bCube,Vec_Ptr_t *vParts)

{
  int iVar1;
  Vec_Ptr_t *p;
  DdNode *pDVar2;
  undefined4 local_3c;
  int i;
  DdNode *bFunc;
  DdNode *bTemp;
  Vec_Ptr_t *vNew;
  Vec_Ptr_t *vParts_local;
  DdNode *bCube_local;
  DdManager *dd_local;
  
  iVar1 = Vec_PtrSize(vParts);
  p = Vec_PtrAlloc(iVar1);
  for (local_3c = 0; iVar1 = Vec_PtrSize(vParts), local_3c < iVar1; local_3c = local_3c + 1) {
    pDVar2 = (DdNode *)Vec_PtrEntry(vParts,local_3c);
    pDVar2 = Cudd_bddAnd(dd,pDVar2,bCube);
    Cudd_Ref(pDVar2);
    Vec_PtrPush(p,pDVar2);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4Multiply( DdManager * dd, DdNode * bCube, Vec_Ptr_t * vParts )
{
    Vec_Ptr_t * vNew;
    DdNode * bTemp, * bFunc;
    int i;
    vNew = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( DdNode *, vParts, bFunc, i )
    {
        bTemp = Cudd_bddAnd( dd, bFunc, bCube );  Cudd_Ref( bTemp );
        Vec_PtrPush( vNew, bTemp );
    }
    return vNew;
}